

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

bool __thiscall
MarkdownHighlighter::isPosInACodeSpan(MarkdownHighlighter *this,int blockNumber,int position)

{
  InlineRange *pIVar1;
  long lVar2;
  long lVar3;
  InlineRange *pIVar4;
  InlineRange *pIVar5;
  InlineRange *pIVar6;
  int blockNumber_local;
  QVector<InlineRange> rangeList;
  QArrayDataPointer<MarkdownHighlighter::InlineRange> local_38;
  
  local_38.d = (Data *)0x0;
  local_38.ptr = (InlineRange *)0x0;
  local_38.size = 0;
  blockNumber_local = blockNumber;
  QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::value
            (&rangeList,&this->_ranges,&blockNumber_local,
             (QList<MarkdownHighlighter::InlineRange> *)&local_38);
  QArrayDataPointer<MarkdownHighlighter::InlineRange>::~QArrayDataPointer(&local_38);
  lVar2 = rangeList.d.size * 0xc;
  pIVar1 = rangeList.d.ptr + rangeList.d.size;
  pIVar5 = rangeList.d.ptr + 2;
  for (lVar3 = rangeList.d.size >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    if (((pIVar5[-2].begin < position) && (position < pIVar5[-2].end)) &&
       (pIVar5[-2].type == CodeSpan)) {
      pIVar6 = pIVar5 + -2;
      goto LAB_00122f72;
    }
    if (((pIVar5[-1].begin < position) && (position < pIVar5[-1].end)) &&
       (pIVar5[-1].type == CodeSpan)) {
      pIVar6 = pIVar5 + -1;
      goto LAB_00122f72;
    }
    if (((pIVar5->begin < position) && (position < pIVar5->end)) &&
       (pIVar6 = pIVar5, pIVar5->type == CodeSpan)) goto LAB_00122f72;
    if (((pIVar5[1].begin < position) && (position < pIVar5[1].end)) && (pIVar5[1].type == CodeSpan)
       ) {
      pIVar6 = pIVar5 + 1;
      goto LAB_00122f72;
    }
    pIVar5 = pIVar5 + 4;
    lVar2 = lVar2 + -0x30;
  }
  lVar2 = lVar2 / 0xc;
  pIVar4 = pIVar5 + -2;
  if (lVar2 != 1) {
    if (lVar2 == 3) {
      if (((pIVar5[-2].begin < position) && (position < pIVar5[-2].end)) &&
         (pIVar6 = pIVar4, pIVar5[-2].type == CodeSpan)) goto LAB_00122f72;
      pIVar4 = pIVar5 + -1;
    }
    else {
      pIVar6 = pIVar1;
      if (lVar2 != 2) goto LAB_00122f72;
    }
    if (((pIVar4->begin < position) && (position < pIVar4->end)) &&
       (pIVar6 = pIVar4, pIVar4->type == CodeSpan)) goto LAB_00122f72;
    pIVar4 = pIVar4 + 1;
  }
  pIVar6 = pIVar1;
  if (pIVar4->type == CodeSpan) {
    pIVar6 = pIVar4;
  }
  if (pIVar4->end <= position) {
    pIVar6 = pIVar1;
  }
  if (position <= pIVar4->begin) {
    pIVar6 = pIVar1;
  }
LAB_00122f72:
  QArrayDataPointer<MarkdownHighlighter::InlineRange>::~QArrayDataPointer(&rangeList.d);
  return pIVar6 != pIVar1;
}

Assistant:

bool MarkdownHighlighter::isPosInACodeSpan(int blockNumber, int position) const
{
    const QVector<InlineRange> rangeList = _ranges.value(blockNumber);
    return std::find_if(rangeList.cbegin(), rangeList.cend(),
                                     [position](const InlineRange& range){
        if (position > range.begin && position < range.end && range.type == RangeType::CodeSpan)
            return true;
        return false;
    }) != rangeList.cend();
}